

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O2

int Gia_ObjFanin2Copy(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  uint Lit;
  int iVar1;
  Gia_Obj_t *pGVar2;
  
  pGVar2 = Gia_ObjFanin2(p,pObj);
  Lit = pGVar2->Value;
  iVar1 = Gia_ObjFaninC2(p,pObj);
  iVar1 = Abc_LitNotCond(Lit,iVar1);
  return iVar1;
}

Assistant:

static inline int          Gia_ObjFanin2Copy( Gia_Man_t * p, Gia_Obj_t * pObj ){ return Abc_LitNotCond(Gia_ObjFanin2(p, pObj)->Value, Gia_ObjFaninC2(p, pObj)); }